

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GhostTorsion.cpp
# Opt level: O0

void __thiscall
OpenMD::GhostTorsion::calcForce(GhostTorsion *this,RealType *angle,bool doParticlePot)

{
  long *plVar1;
  reference ppAVar2;
  byte in_DL;
  double *in_RSI;
  Vector3<double> *in_RDI;
  double dVar3;
  Vector3d f3;
  Vector3d f2;
  Vector3d f1;
  Vector3d dcosdB;
  Vector3d dcosdA;
  RealType dVdcosPhi;
  RealType cos_phi;
  RealType rB;
  Vector3d B;
  RealType rA;
  Vector3d A;
  Vector3d r43;
  Vector3d r32;
  Vector3d r21;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  DirectionalAtom *ghostAtom;
  Vector<double,_3U> *in_stack_fffffffffffffb58;
  Vector<double,_3U> *v;
  Vector<double,_3U> *in_stack_fffffffffffffb60;
  Vector<double,_3U> *v2;
  StuntDouble *in_stack_fffffffffffffb68;
  StuntDouble *in_stack_fffffffffffffb70;
  value_type this_00;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb78;
  double *this_01;
  Vector3<double> *v1;
  Vector3d *in_stack_fffffffffffffbd8;
  Snapshot *in_stack_fffffffffffffbe0;
  Vector<double,_3U> local_380 [17];
  Vector<double,_3U> *local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1b8;
  Vector3<double> local_b0 [6];
  value_type local_20;
  byte local_11;
  double *local_10;
  
  local_11 = in_DL & 1;
  this_01 = (in_RDI->super_Vector<double,_3U>).data_ + 2;
  local_10 = in_RSI;
  ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_01,2);
  local_20 = *ppAVar2;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_01,0);
  StuntDouble::getPos(in_stack_fffffffffffffb68);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_01,1);
  StuntDouble::getPos(in_stack_fffffffffffffb68);
  StuntDouble::getPos(in_stack_fffffffffffffb68);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  SnapshotManager::getCurrentSnapshot
            ((SnapshotManager *)(in_RDI->super_Vector<double,_3U>).data_[1]);
  Snapshot::wrapVector(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  v1 = local_b0;
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  SnapshotManager::getCurrentSnapshot
            ((SnapshotManager *)(in_RDI->super_Vector<double,_3U>).data_[1]);
  Snapshot::wrapVector(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  StuntDouble::getA(in_stack_fffffffffffffb68);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)this_01);
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffb78,(uint)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x238758);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x238765);
  cross<double>(v1,in_RDI);
  local_1b8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x23878f);
  cross<double>(v1,in_RDI);
  local_1d8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x2387c2);
  if (1e-06 <= local_1b8 * local_1d8) {
    Vector<double,_3U>::normalize(in_stack_fffffffffffffb60);
    Vector<double,_3U>::normalize(in_stack_fffffffffffffb60);
    local_1e0 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffb70,
                               (Vector<double,_3U> *)in_stack_fffffffffffffb68);
    plVar1 = (long *)in_RDI[4].super_Vector<double,_3U>.data_[1];
    (**(code **)(*plVar1 + 0x10))(local_1e0,plVar1,in_RDI + 6,&local_1e8);
    OpenMD::operator*((double)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    operator/((Vector<double,_3U> *)in_stack_fffffffffffffb68,(double)in_stack_fffffffffffffb60);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58)
    ;
    OpenMD::operator*((double)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    operator/((Vector<double,_3U> *)in_stack_fffffffffffffb68,(double)in_stack_fffffffffffffb60);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58)
    ;
    v = local_1e8;
    cross<double>(v1,in_RDI);
    OpenMD::operator*((double)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb60,v);
    v2 = local_1e8;
    cross<double>(v1,in_RDI);
    cross<double>(v1,in_RDI);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb68,v2);
    OpenMD::operator*((double)in_stack_fffffffffffffb68,v2);
    Vector3<double>::Vector3((Vector3<double> *)v2,v);
    cross<double>(v1,in_RDI);
    OpenMD::operator*((double)local_1e8,v2);
    Vector3<double>::Vector3((Vector3<double> *)v2,v);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
               ((in_RDI->super_Vector<double,_3U>).data_ + 2),0);
    StuntDouble::addFrc(in_stack_fffffffffffffb70,(Vector3d *)local_1e8);
    ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                         ((in_RDI->super_Vector<double,_3U>).data_ + 2),1);
    this_00 = *ppAVar2;
    OpenMD::operator-(local_1e8,v2);
    Vector3<double>::Vector3((Vector3<double> *)v2,v);
    StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)local_1e8);
    OpenMD::operator-(local_1e8);
    Vector3<double>::Vector3((Vector3<double> *)v2,v);
    StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)local_1e8);
    Vector<double,_3U>::negate(local_380);
    cross<double>(v1,in_RDI);
    StuntDouble::addTrq(&this_00->super_StuntDouble,(Vector3d *)local_1e8);
    if ((local_11 & 1) != 0) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 ((in_RDI->super_Vector<double,_3U>).data_ + 2),0);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,local_1e8->data_);
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 ((in_RDI->super_Vector<double,_3U>).data_ + 2),1);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,local_1e8->data_);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,local_1e8->data_);
    }
    dVar3 = acos(local_1e0);
    *local_10 = (dVar3 / 3.141592653589793) * 180.0;
  }
  return;
}

Assistant:

void GhostTorsion::calcForce(RealType& angle, bool doParticlePot) {
    DirectionalAtom* ghostAtom = static_cast<DirectionalAtom*>(atoms_[2]);

    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = ghostAtom->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    Vector3d r32 = pos2 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r32);
    Vector3d r43 = ghostAtom->getA().transpose().getColumn(2);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r21, r32);
    RealType rA = A.length();
    Vector3d B  = cross(r32, r43);
    RealType rB = B.length();

    /*
     If either of the two cross product vectors is tiny, that means
     the three atoms involved are colinear, and the torsion angle is
     going to be undefined.  The easiest check for this problem is
     to use the product of the two lengths.
  */
    if (rA * rB < OpenMD::epsilon) return;

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);

    RealType dVdcosPhi;
    torsionType_->calcForce(cos_phi, potential_, dVdcosPhi);

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    Vector3d f1 = dVdcosPhi * cross(r32, dcosdA);
    Vector3d f2 = dVdcosPhi * (cross(r43, dcosdB) - cross(r21, dcosdA));
    Vector3d f3 = dVdcosPhi * cross(dcosdB, r32);

    atoms_[0]->addFrc(f1);
    atoms_[1]->addFrc(f2 - f1);

    ghostAtom->addFrc(-f2);

    f3.negate();
    ghostAtom->addTrq(cross(r43, f3));

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      ghostAtom->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }